

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O2

void buffer_destroy(Buffer *buffer)

{
  MOJOSHADER_free UNRECOVERED_JUMPTABLE;
  void *pvVar1;
  
  if (buffer != (Buffer *)0x0) {
    UNRECOVERED_JUMPTABLE = buffer->f;
    pvVar1 = buffer->d;
    buffer_empty(buffer);
    (*UNRECOVERED_JUMPTABLE)(buffer,pvVar1);
    return;
  }
  return;
}

Assistant:

void buffer_destroy(Buffer *buffer)
{
    if (buffer != NULL)
    {
        MOJOSHADER_free f = buffer->f;
        void *d = buffer->d;
        buffer_empty(buffer);
        f(buffer, d);
    } // if
}